

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str)

{
  char cVar1;
  pointer pcVar2;
  char *pcVar3;
  pointer pbVar4;
  size_type sVar5;
  bool bVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  long lVar8;
  long *plVar9;
  ulong uVar10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  string value;
  string delims;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  value_type local_f8;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  char *local_b8;
  ulong local_b0;
  char local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 *local_78;
  long *local_70;
  char *local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_d8[0] = local_c8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"\'\"`","");
  local_b8 = (str->_M_dataplus)._M_p;
  local_f8._M_dataplus._M_p = local_b8 + str->_M_string_length;
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_78);
  str->_M_string_length = (long)local_78 - (long)(str->_M_dataplus)._M_p;
  *local_78 = 0;
  _Var7 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar2 = (str->_M_dataplus)._M_p;
  if (pcVar2 + str->_M_string_length == _Var7._M_current) {
    str->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  else {
    ::std::__cxx11::string::_M_erase((ulong)str,0);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (str->_M_string_length != 0) {
    bVar6 = false;
    do {
      paVar12 = &local_f8.field_2;
      lVar8 = ::std::__cxx11::string::find
                        ((char)local_d8,(ulong)(uint)(int)*(str->_M_dataplus)._M_p);
      pcVar3 = (str->_M_dataplus)._M_p;
      if (lVar8 == -1) {
        _Var7 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string)::_lambda(char)_1_>>
                          (pcVar3,pcVar3 + str->_M_string_length);
        pcVar2 = (str->_M_dataplus)._M_p;
        if (_Var7._M_current == pcVar2 + str->_M_string_length) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,str);
          ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x15c01f);
        }
        else {
          local_f8._M_dataplus._M_p = (pointer)paVar12;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_f8,pcVar2,_Var7._M_current);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_f8);
          local_b8 = local_a8;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_b8,_Var7._M_current,
                     (str->_M_dataplus)._M_p + str->_M_string_length);
          ::std::__cxx11::string::operator=((string *)str,(string *)&local_b8);
          if (local_b8 != local_a8) {
            operator_delete(local_b8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
        }
      }
      else {
        cVar1 = *pcVar3;
        lVar8 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)cVar1);
        if (lVar8 == -1) {
LAB_0014f738:
          ::std::__cxx11::string::substr((ulong)&local_f8,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != paVar12) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x15c01f);
        }
        else {
          if ((str->_M_dataplus)._M_p[lVar8 + -1] == '\\') {
            do {
              lVar8 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)cVar1);
              if (lVar8 == -1) {
                bVar6 = true;
                goto LAB_0014f738;
              }
            } while ((str->_M_dataplus)._M_p[lVar8 + -1] == '\\');
            bVar6 = true;
          }
          ::std::__cxx11::string::substr((ulong)&local_f8,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != paVar12) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          ::std::__cxx11::string::substr((ulong)&local_f8,(ulong)str);
          ::std::__cxx11::string::operator=((string *)str,(string *)&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != paVar12) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
        }
      }
      if (bVar6) {
        pbVar4 = (__return_storage_ptr__->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pcVar2 = pbVar4[-1]._M_dataplus._M_p;
        local_98 = &local_88;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar2,pcVar2 + pbVar4[-1]._M_string_length);
        local_b8 = local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"\\","");
        plVar9 = (long *)::std::__cxx11::string::_M_replace_aux((ulong)&local_b8,local_b0,0,'\x01');
        local_70 = &local_60;
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_60 = *plVar11;
          lStack_58 = plVar9[3];
        }
        else {
          local_60 = *plVar11;
          local_70 = (long *)*plVar9;
        }
        local_68 = (char *)plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        local_50 = local_40;
        ::std::__cxx11::string::_M_construct((ulong)&local_50,'\x01');
        uVar10 = ::std::__cxx11::string::find((char *)&local_98,(ulong)local_70,0);
        sVar5 = local_90;
        while (uVar10 != 0xffffffffffffffff) {
          local_90 = sVar5;
          ::std::__cxx11::string::replace((ulong)&local_98,uVar10,local_68,(ulong)local_50);
          uVar10 = ::std::__cxx11::string::find((char *)&local_98,(ulong)local_70,uVar10 + local_48)
          ;
          sVar5 = local_90;
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        if (local_98 != &local_88) {
          local_f8._M_dataplus._M_p = (pointer)local_98;
        }
        local_f8.field_2._M_allocated_capacity._1_7_ = local_88._M_allocated_capacity._1_7_;
        local_f8.field_2._M_local_buf[0] = local_88._M_local_buf[0];
        local_90 = 0;
        local_88._M_local_buf[0] = '\0';
        local_f8._M_string_length = sVar5;
        local_98 = &local_88;
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((__return_storage_ptr__->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1),(string *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98);
        }
        bVar6 = false;
      }
      local_b8 = (str->_M_dataplus)._M_p;
      local_f8._M_dataplus._M_p = local_b8 + str->_M_string_length;
      ::std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                (&local_78,&local_f8,&local_b8);
      str->_M_string_length = (long)local_78 - (long)(str->_M_dataplus)._M_p;
      *local_78 = 0;
      _Var7 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                        ();
      pcVar2 = (str->_M_dataplus)._M_p;
      if (pcVar2 + str->_M_string_length == _Var7._M_current) {
        str->_M_string_length = 0;
        *pcVar2 = '\0';
      }
      else {
        ::std::__cxx11::string::_M_erase((ulong)str,0);
      }
    } while (str->_M_string_length != 0);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split_up(std::string str) {

    const std::string delims("\'\"`");
    auto find_ws = [](char ch) { return std::isspace<char>(ch, std::locale()); };
    trim(str);

    std::vector<std::string> output;
    bool embeddedQuote = false;
    char keyChar = ' ';
    while(!str.empty()) {
        if(delims.find_first_of(str[0]) != std::string::npos) {
            keyChar = str[0];
            auto end = str.find_first_of(keyChar, 1);
            while((end != std::string::npos) && (str[end - 1] == '\\')) { // deal with escaped quotes
                end = str.find_first_of(keyChar, end + 1);
                embeddedQuote = true;
            }
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        // transform any embedded quotes into the regular character
        if(embeddedQuote) {
            output.back() = find_and_replace(output.back(), std::string("\\") + keyChar, std::string(1, keyChar));
            embeddedQuote = false;
        }
        trim(str);
    }
    return output;
}